

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

lyd_node * lyd_new_yangdata(lys_module *module,char *name_template,char *name)

{
  lys_node *name_00;
  char *mod;
  int iVar1;
  size_t sVar2;
  lys_node *parent;
  lys_node *local_38;
  lys_node *snode;
  lys_node *schema;
  char *name_local;
  char *name_template_local;
  lys_module *module_local;
  
  snode = (lys_node *)0x0;
  schema = (lys_node *)name;
  name_local = name_template;
  name_template_local = (char *)module;
  if (((module == (lys_module *)0x0) || (name_template == (char *)0x0)) || (name == (char *)0x0)) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid arguments (%s()).","lyd_new_yangdata");
    module_local = (lys_module *)0x0;
  }
  else {
    sVar2 = strlen(name_template);
    parent = lyp_get_yang_data_template(module,name_template,(int)sVar2);
    mod = name_template_local;
    name_00 = schema;
    snode = parent;
    if (parent == (lys_node *)0x0) {
      ly_log(*(ly_ctx **)name_template_local,LY_LLERR,LY_EINVAL,
             "Failed to find yang-data template \"%s\".",name_local);
      module_local = (lys_module *)0x0;
    }
    else {
      sVar2 = strlen((char *)schema);
      iVar1 = lys_getnext_data((lys_module *)mod,parent,(char *)name_00,(int)sVar2,LYS_CONTAINER,0,
                               &local_38);
      if ((iVar1 == 0) && (local_38 != (lys_node *)0x0)) {
        module_local = (lys_module *)_lyd_new((lyd_node *)0x0,local_38,0);
      }
      else {
        ly_log(*(ly_ctx **)name_template_local,LY_LLERR,LY_EINVAL,
               "Failed to find \"%s\" as a container child of \"%s:%s\".",schema,
               *(undefined8 *)(name_template_local + 8),snode->name);
        module_local = (lys_module *)0x0;
      }
    }
  }
  return (lyd_node *)module_local;
}

Assistant:

lyd_node *
lyd_new_yangdata(const struct lys_module *module, const char *name_template, const char *name)
{
    const struct lys_node *schema = NULL, *snode;

    if (!module || !name_template || !name) {
        LOGARG;
        return NULL;
    }

    schema = lyp_get_yang_data_template(module, name_template, strlen(name_template));
    if (!schema) {
        LOGERR(module->ctx, LY_EINVAL, "Failed to find yang-data template \"%s\".", name_template);
        return NULL;
    }

    if (lys_getnext_data(module, schema, name, strlen(name), LYS_CONTAINER, 0, &snode) || !snode) {
        LOGERR(module->ctx, LY_EINVAL, "Failed to find \"%s\" as a container child of \"%s:%s\".",
               name, module->name, schema->name);
        return NULL;
    }

    return _lyd_new(NULL, snode, 0);
}